

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *__ptr;
  Allocator *pAVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int *piVar24;
  pointer pMVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  sbyte sVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  int *piVar34;
  ulong uVar35;
  long lVar36;
  bool bVar37;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  uint local_104;
  int _outc;
  int _outd;
  int _hoffset;
  uint local_f4;
  int local_f0;
  int local_ec;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_d0;
  Allocator *local_c8;
  int iStack_c0;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  int iStack_b0;
  size_t local_a8;
  int _coffset;
  size_t local_88;
  int local_80;
  int _doffset;
  Mat m_2;
  
  local_104 = bottom_blob->w;
  local_f4 = bottom_blob->h;
  local_80 = bottom_blob->d;
  local_f0 = bottom_blob->c;
  iVar27 = bottom_blob->dims;
  local_88 = bottom_blob->elemsize;
  local_ec = bottom_blob->elempack;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (iVar27 - 1U < 4) {
      lVar28 = (long)(int)local_104;
      m.w = local_104;
      switch(iVar27) {
      case 1:
        m.w = local_ec * local_104;
        m.dims = 1;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        m.cstep = (size_t)m.w;
        goto LAB_0028064a;
      case 2:
        m.h = local_ec * local_f4;
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar28;
        goto LAB_002806d0;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar28 = (int)local_f4 * lVar28;
        break;
      case 4:
        m.dims = 4;
        lVar28 = (int)local_f4 * lVar28 * (long)local_80;
        m.d = local_80;
      }
      m.c = local_ec * local_f0;
      m.cstep = lVar28 + 3U & 0x3ffffffffffffffc;
      m.h = local_f4;
LAB_0028064a:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_002806d0:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    piVar34 = &_doffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,piVar34,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar24 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar24 != (int *)0x0) {
      LOCK();
      *piVar24 = *piVar24 + -1;
      UNLOCK();
      if (*piVar24 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_002809e8;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar25 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = bottom_blob->w;
    lVar28 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar28;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar28 * m.w;
    break;
  case 3:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    m.d = 1;
    lVar28 = (long)m.h * (long)m.w;
    goto LAB_00280801;
  case 4:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.d = bottom_blob->d;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 4;
    lVar28 = (long)m.h * (long)m.w * (long)m.d;
LAB_00280801:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar28 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar34 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->refcount;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar25->cstep = 0;
    pMVar25->data = (void *)0x0;
    pMVar25->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar25->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar25->elemsize + 4) = 0;
    pMVar25->dims = 0;
    pMVar25->w = 0;
    pMVar25->h = 0;
    pMVar25->d = 0;
    pMVar25->c = 0;
    piVar34 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar25->data = m.data;
    pMVar25->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar25->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
    pMVar25->elempack = m.elempack;
    pMVar25->allocator = m.allocator;
    pMVar25->dims = m.dims;
    pMVar25->w = m.w;
    pMVar25->h = m.h;
    pMVar25->d = m.d;
    pMVar25->c = m.c;
    pMVar25->cstep = m.cstep;
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar34 = &_doffset;
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,piVar34,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
LAB_002809e8:
  if (local_ec == 4) {
    if (iVar27 - 1U < 4) {
      iVar31 = _outc >> 2;
      switch(iVar27) {
      case 1:
        uVar33 = _outw & 3;
        iVar27 = (uint)(uVar33 == 0) * 3 + 1;
        uVar32 = (long)_outw % (long)iVar27;
        if (local_104 == _outw / iVar27 && uVar33 == 0) {
          if (top_blob == bottom_blob) {
            return 0;
          }
          piVar34 = bottom_blob->refcount;
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + 1;
            UNLOCK();
          }
          piVar34 = top_blob->refcount;
          if (piVar34 == (int *)0x0) goto LAB_002817b3;
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 != 0) goto LAB_002817b3;
          __ptr = top_blob->data;
          pAVar1 = top_blob->allocator;
          goto joined_r0x00280f5d;
        }
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(top_blob,_outw / iVar27,(local_88 >> 2) << (uVar33 == 0) * '\x02',iVar27,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar27 = _woffset + 3;
            if (-1 < _woffset) {
              iVar27 = _woffset;
            }
            crop_pack4_sse(bottom_blob,top_blob,0,iVar27 >> 2);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        if (_outw == local_104) {
          iVar27 = (uint)((_outh & 3U) == 0) * 3 + 1;
          uVar32 = (long)_outh % (long)iVar27;
          if (((_outh & 3U) == 0) && (_outh / iVar27 == local_f4)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar34 = bottom_blob->refcount;
            if (piVar34 != (int *)0x0) {
              LOCK();
              *piVar34 = *piVar34 + 1;
              UNLOCK();
            }
            piVar34 = top_blob->refcount;
            if (piVar34 == (int *)0x0) goto LAB_002817b3;
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 != 0) goto LAB_002817b3;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x00280f5d;
          }
        }
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh >> 2,(local_88 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar27 = _hoffset + 3;
            if (-1 < _hoffset) {
              iVar27 = _hoffset;
            }
            crop_pack4_sse(bottom_blob,top_blob,iVar27 >> 2,_woffset);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar33 = _outc & 3;
        uVar35 = local_88 >> 2;
        uVar30 = local_f4 ^ _outh | local_104 ^ _outw;
        bVar37 = uVar30 == 0;
        if (bVar37) {
          iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
          uVar32 = (long)_outc % (long)iVar27;
          if (((_outc & 3U) == 0) && (_outc / iVar27 == local_f0)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar34 = bottom_blob->refcount;
            if (piVar34 != (int *)0x0) {
              LOCK();
              *piVar34 = *piVar34 + 1;
              UNLOCK();
            }
            piVar34 = top_blob->refcount;
            if (piVar34 == (int *)0x0) goto LAB_002817b3;
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 != 0) goto LAB_002817b3;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x00280f5d;
          }
        }
        if (((_coffset | _outc) & 3U) == 0) {
          uVar32 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar32 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar32;
          m.elemsize._4_4_ = (undefined4)(uVar32 >> 0x20);
          uVar8 = bottom_blob->dims;
          uVar9 = bottom_blob->w;
          uVar10 = bottom_blob->h;
          uVar11 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar32 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar32;
          m.dims = uVar8;
          m.w = uVar9;
          m.h = uVar10;
          m.d = uVar11;
          m.c = iVar31;
          if (bVar37) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,
                       CONCAT31((int3)(uVar30 >> 8),bVar37),(void *)(ulong)(uint)_outh);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar34 = top_blob->refcount;
              if (piVar34 != (int *)0x0) {
                LOCK();
                *piVar34 = *piVar34 + -1;
                UNLOCK();
                if (*piVar34 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_d0;
              top_blob->allocator = local_c8;
              top_blob->dims = iStack_c0;
              top_blob->w = iStack_bc;
              top_blob->h = iStack_b8;
              top_blob->d = iStack_b4;
              top_blob->c = iStack_b0;
              top_blob->cstep = local_a8;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_c8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_c8->_vptr_Allocator[3])();
                }
              }
            }
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00281903;
          }
          else {
LAB_00281903:
            iVar27 = _outc + 3;
            if (-1 < _outc) {
              iVar27 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,iVar27 >> 2,uVar35 << (uVar33 == 0) * '\x02',4,
                        opt->blob_allocator);
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
              if (0 < top_blob->c) {
                lVar28 = 0;
                do {
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar28 *
                                 (long)bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  m_2.w = top_blob->w;
                  m_2.h = top_blob->h;
                  m_2.elemsize = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar28 * m_2.elemsize + (long)top_blob->data
                                     );
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount = (int *)0x0;
                  m_2.c = top_blob->d;
                  m_2.d = 1;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0)
                              / m_2.elemsize;
                  if (top_blob->dims == 4) {
                    m_2.cstep = (long)m_2.h * (long)m_2.w;
                  }
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  lVar28 = lVar28 + 1;
                } while (lVar28 < top_blob->c);
              }
              iVar27 = 0;
            }
          }
          piVar34 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar34 == (int *)0x0) {
            return iVar27;
          }
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 != 0) {
            return iVar27;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar27;
          }
          goto joined_r0x00281e47;
        }
        break;
      case 4:
        uVar33 = _outc & 3;
        uVar35 = local_88 >> 2;
        bVar37 = local_80 == _outd;
        bVar2 = local_f4 == _outh;
        bVar3 = local_104 == _outw;
        if (bVar37 && (bVar2 && bVar3)) {
          iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
          uVar32 = (long)_outc % (long)iVar27;
          if (((_outc & 3U) == 0) && (_outc / iVar27 == local_f0)) {
            if (top_blob == bottom_blob) {
              return 0;
            }
            piVar34 = bottom_blob->refcount;
            if (piVar34 != (int *)0x0) {
              LOCK();
              *piVar34 = *piVar34 + 1;
              UNLOCK();
            }
            piVar34 = top_blob->refcount;
            if (piVar34 == (int *)0x0) goto LAB_002817b3;
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 != 0) goto LAB_002817b3;
            __ptr = top_blob->data;
            pAVar1 = top_blob->allocator;
            goto joined_r0x00280f5d;
          }
        }
        if (((_coffset | _outc) & 3U) == 0) {
          uVar32 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * uVar32 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (undefined4)uVar32;
          m.elemsize._4_4_ = (undefined4)(uVar32 >> 0x20);
          uVar16 = bottom_blob->dims;
          uVar17 = bottom_blob->w;
          uVar18 = bottom_blob->h;
          uVar19 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar32 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar32;
          m.dims = uVar16;
          m.w = uVar17;
          m.h = uVar18;
          m.d = uVar19;
          m.c = iVar31;
          if (bVar37 && (bVar2 && bVar3)) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,_outd,
                       (void *)CONCAT71((int7)((ulong)piVar34 >> 8),bVar37 && (bVar2 && bVar3)));
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish)->data =
                     *(int *)&(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar34 = top_blob->refcount;
              if (piVar34 != (int *)0x0) {
                LOCK();
                *piVar34 = *piVar34 + -1;
                UNLOCK();
                if (*piVar34 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              top_blob->elemsize =
                   (size_t)bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              top_blob->elempack = iStack_d0;
              top_blob->allocator = local_c8;
              top_blob->dims = iStack_c0;
              top_blob->w = iStack_bc;
              top_blob->h = iStack_b8;
              top_blob->d = iStack_b4;
              top_blob->c = iStack_b0;
              top_blob->cstep = local_a8;
            }
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_c8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_c8->_vptr_Allocator[3])();
                }
              }
            }
            iVar27 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00281c21;
          }
          else {
LAB_00281c21:
            iVar27 = _outc + 3;
            if (-1 < _outc) {
              iVar27 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar27 >> 2,uVar35 << (uVar33 == 0) * '\x02',4,
                        opt->blob_allocator);
            iVar27 = -100;
            if (top_blob->data != (void *)0x0) {
              uVar35 = (ulong)top_blob->c;
              if (top_blob->cstep * uVar35 != 0) {
                if (0 < top_blob->c) {
                  uVar32 = (ulong)(uint)_outd;
                  lVar28 = 0;
                  do {
                    if (0 < (int)uVar32) {
                      lVar36 = 0;
                      do {
                        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)((long)m.data +
                                      (long)(_doffset + (int)lVar36) *
                                      (long)bottom_blob_shapes.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                      (long)m.h * (long)m.w +
                                      m.cstep * lVar28 *
                                      (long)bottom_blob_shapes.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        m_2.w = top_blob->w;
                        m_2.h = top_blob->h;
                        m_2.elemsize = top_blob->elemsize;
                        m_2.elempack = top_blob->elempack;
                        m_2.allocator = top_blob->allocator;
                        m_2.cstep = (long)m_2.h * (long)m_2.w;
                        m_2.data = (void *)((long)top_blob->data +
                                           lVar36 * m_2.elemsize * m_2.cstep +
                                           top_blob->cstep * lVar28 * m_2.elemsize);
                        m_2.refcount = (int *)0x0;
                        m_2.dims = 2;
                        m_2.d = 1;
                        m_2.c = 1;
                        crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                        uVar32 = (ulong)_outd;
                        lVar36 = lVar36 + 1;
                      } while (lVar36 < (long)uVar32);
                      uVar35 = (ulong)(uint)top_blob->c;
                    }
                    lVar28 = lVar28 + 1;
                  } while (lVar28 < (int)uVar35);
                }
                iVar27 = 0;
              }
            }
          }
          piVar34 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar34 == (int *)0x0) {
            return iVar27;
          }
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 != 0) {
            return iVar27;
          }
          if (m.allocator != (Allocator *)0x0) {
            (*(m.allocator)->_vptr_Allocator[3])();
            return iVar27;
          }
          goto joined_r0x00281e47;
        }
      }
    }
    goto switchD_00280a19_default;
  }
  if (local_ec != 8) goto switchD_00280a19_default;
  switch(iVar27) {
  case 1:
    uVar33 = _outw & 7;
    bVar37 = (_outw & 3U) == 0;
    iVar27 = 8;
    if (uVar33 != 0) {
      iVar27 = (uint)bVar37 * 3 + 1;
    }
    sVar29 = 3;
    if (uVar33 != 0) {
      sVar29 = bVar37 * '\x02';
    }
    uVar32 = (long)_outw % (long)iVar27;
    if (local_104 == _outw / iVar27 && uVar33 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar34 = bottom_blob->refcount;
      if (piVar34 != (int *)0x0) {
        LOCK();
        *piVar34 = *piVar34 + 1;
        UNLOCK();
      }
      piVar34 = top_blob->refcount;
      if (piVar34 == (int *)0x0) goto LAB_002817b3;
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 != 0) goto LAB_002817b3;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
joined_r0x00280f5d:
      if (pAVar1 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar32 & 0xffffffff);
      }
LAB_002817b3:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar34 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar34;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar27 = bottom_blob->w;
      iVar31 = bottom_blob->h;
      iVar26 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar27;
      top_blob->h = iVar31;
      top_blob->d = iVar26;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 7U) == 0) {
      Mat::create(top_blob,_outw / iVar27,(local_88 >> 3) << sVar29,8,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep != 0) {
        iVar27 = _woffset + 7;
        if (-1 < _woffset) {
          iVar27 = _woffset;
        }
        crop_pack8_avx(bottom_blob,top_blob,0,iVar27 >> 3);
        return 0;
      }
      return -100;
    }
    break;
  case 2:
    sVar29 = 3;
    if ((_outh & 7U) != 0) {
      sVar29 = ((_outh & 3U) == 0) * '\x02';
    }
    if (_outw == local_104) {
      iVar27 = 8;
      if ((_outh & 7U) != 0) {
        iVar27 = (uint)((_outh & 3U) == 0) * 3 + 1;
      }
      uVar32 = (long)_outh % (long)iVar27;
      if (((_outh & 7U) == 0) && (_outh / iVar27 == local_f4)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar34 = bottom_blob->refcount;
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + 1;
          UNLOCK();
        }
        piVar34 = top_blob->refcount;
        if (piVar34 == (int *)0x0) goto LAB_002817b3;
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 != 0) goto LAB_002817b3;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00280f5d;
      }
    }
    if (((_hoffset | _outh) & 7U) == 0) {
      iVar27 = _outh + 7;
      if (-1 < _outh) {
        iVar27 = _outh;
      }
      Mat::create(top_blob,_outw,iVar27 >> 3,(local_88 >> 3) << sVar29,8,opt->blob_allocator);
      if (top_blob->data != (void *)0x0) {
        if ((long)top_blob->c * top_blob->cstep != 0) {
          iVar27 = _hoffset + 7;
          if (-1 < _hoffset) {
            iVar27 = _hoffset;
          }
          crop_pack8_avx(bottom_blob,top_blob,iVar27 >> 3,_woffset);
          return 0;
        }
        return -100;
      }
      return -100;
    }
    break;
  case 3:
    uVar35 = local_88 >> 3;
    sVar29 = 3;
    if ((_outc & 7U) != 0) {
      sVar29 = ((_outc & 3U) == 0) * '\x02';
    }
    if (local_f4 == _outh && local_104 == _outw) {
      iVar27 = 8;
      if ((_outc & 7U) != 0) {
        iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      uVar32 = (long)_outc % (long)iVar27;
      if (((_outc & 7U) == 0) && (_outc / iVar27 == local_f0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar34 = bottom_blob->refcount;
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + 1;
          UNLOCK();
        }
        piVar34 = top_blob->refcount;
        if (piVar34 == (int *)0x0) goto LAB_002817b3;
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 != 0) goto LAB_002817b3;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00280f5d;
      }
    }
    if (((_coffset | _outc) & 7U) != 0) break;
    iVar27 = _coffset + 7;
    if (-1 < _coffset) {
      iVar27 = _coffset;
    }
    iVar31 = _outc + 7;
    if (-1 < _outc) {
      iVar31 = _outc;
    }
    iVar31 = iVar31 >> 3;
    uVar32 = bottom_blob->elemsize;
    m.data = (void *)((long)(iVar27 >> 3) * bottom_blob->cstep * uVar32 + (long)bottom_blob->data);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar32;
    m.elemsize._4_4_ = (undefined4)(uVar32 >> 0x20);
    uVar4 = bottom_blob->dims;
    uVar5 = bottom_blob->w;
    uVar6 = bottom_blob->h;
    uVar7 = bottom_blob->d;
    m.cstep = ((long)bottom_blob->d * uVar32 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
              0xfffffffffffffff0) / uVar32;
    m.dims = uVar4;
    m.w = uVar5;
    m.h = uVar6;
    m.d = uVar7;
    m.c = iVar31;
    if (local_f4 != _outh || local_104 != _outw) {
LAB_00281f33:
      Mat::create(top_blob,_outw,_outh,iVar31,uVar35 << sVar29,8,opt->blob_allocator);
      iVar27 = -100;
      if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
        if (0 < top_blob->c) {
          lVar28 = 0;
          do {
            bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
            bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(m.cstep * lVar28 *
                           (long)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + (long)m.data);
            bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar28 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
            lVar28 = lVar28 + 1;
          } while (lVar28 < top_blob->c);
        }
        iVar27 = 0;
      }
    }
    else {
      Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,iVar31,
                 (void *)(ulong)(uint)_outh);
      if ((Mat *)&bottom_blob_shapes != top_blob) {
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + 1;
          UNLOCK();
        }
        piVar34 = top_blob->refcount;
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data =
             bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
        top_blob->refcount =
             (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        top_blob->elemsize =
             (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        top_blob->elempack = iStack_d0;
        top_blob->allocator = local_c8;
        top_blob->dims = iStack_c0;
        top_blob->w = iStack_bc;
        top_blob->h = iStack_b8;
        top_blob->d = iStack_b4;
        top_blob->c = iStack_b0;
        top_blob->cstep = local_a8;
      }
      if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->data =
             *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->data + -1;
        UNLOCK();
        if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
          if (local_c8 == (Allocator *)0x0) {
            if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            (*local_c8->_vptr_Allocator[3])();
          }
        }
      }
      iVar27 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar31 = _outc + 7;
        if (-1 < _outc) {
          iVar31 = _outc;
        }
        iVar31 = iVar31 >> 3;
        goto LAB_00281f33;
      }
    }
    piVar34 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar34 == (int *)0x0) {
      return iVar27;
    }
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 != 0) {
      return iVar27;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar27;
    }
joined_r0x00281e47:
    m.allocator = (Allocator *)0x0;
    if (m.data == (void *)0x0) {
      return iVar27;
    }
    goto LAB_00281716;
  case 4:
    uVar35 = local_88 >> 3;
    sVar29 = 3;
    if ((_outc & 7U) != 0) {
      sVar29 = ((_outc & 3U) == 0) * '\x02';
    }
    if (local_80 == _outd && (local_f4 == _outh && local_104 == _outw)) {
      iVar27 = 8;
      if ((_outc & 7U) != 0) {
        iVar27 = (uint)((_outc & 3U) == 0) * 3 + 1;
      }
      uVar32 = (long)_outc % (long)iVar27;
      if (((_outc & 7U) == 0) && (_outc / iVar27 == local_f0)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar34 = bottom_blob->refcount;
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + 1;
          UNLOCK();
        }
        piVar34 = top_blob->refcount;
        if (piVar34 == (int *)0x0) goto LAB_002817b3;
        LOCK();
        *piVar34 = *piVar34 + -1;
        UNLOCK();
        if (*piVar34 != 0) goto LAB_002817b3;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x00280f5d;
      }
    }
    if (((_coffset | _outc) & 7U) == 0) {
      iVar27 = _coffset + 7;
      if (-1 < _coffset) {
        iVar27 = _coffset;
      }
      iVar31 = _outc + 7;
      if (-1 < _outc) {
        iVar31 = _outc;
      }
      uVar33 = iVar31 >> 3;
      uVar32 = bottom_blob->elemsize;
      m.data = (void *)((long)(iVar27 >> 3) * bottom_blob->cstep * uVar32 + (long)bottom_blob->data)
      ;
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar32;
      m.elemsize._4_4_ = (undefined4)(uVar32 >> 0x20);
      uVar12 = bottom_blob->dims;
      uVar13 = bottom_blob->w;
      uVar14 = bottom_blob->h;
      uVar15 = bottom_blob->d;
      m.cstep = ((long)bottom_blob->d * uVar32 * (long)bottom_blob->h * (long)bottom_blob->w + 0xf &
                0xfffffffffffffff0) / uVar32;
      m.dims = uVar12;
      m.w = uVar13;
      m.h = uVar14;
      m.d = uVar15;
      m.c = uVar33;
      if (local_80 != _outd || (local_f4 != _outh || local_104 != _outw)) {
LAB_00282254:
        Mat::create(top_blob,_outw,_outh,_outd,uVar33,uVar35 << sVar29,8,opt->blob_allocator);
        iVar27 = -100;
        if (top_blob->data != (void *)0x0) {
          uVar35 = (ulong)top_blob->c;
          if (top_blob->cstep * uVar35 != 0) {
            if (0 < top_blob->c) {
              uVar32 = (ulong)(uint)_outd;
              lVar28 = 0;
              do {
                if (0 < (int)uVar32) {
                  lVar36 = 0;
                  do {
                    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)m.data +
                                  (long)(_doffset + (int)lVar36) *
                                  (long)bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                                  (long)m.h * (long)m.w +
                                  m.cstep * lVar28 *
                                  (long)bottom_blob_shapes.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    m_2.w = top_blob->w;
                    m_2.h = top_blob->h;
                    m_2.elemsize = top_blob->elemsize;
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.cstep = (long)m_2.h * (long)m_2.w;
                    m_2.data = (void *)((long)top_blob->data +
                                       lVar36 * m_2.elemsize * m_2.cstep +
                                       top_blob->cstep * lVar28 * m_2.elemsize);
                    m_2.refcount = (int *)0x0;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                    uVar32 = (ulong)_outd;
                    lVar36 = lVar36 + 1;
                  } while (lVar36 < (long)uVar32);
                  uVar35 = (ulong)(uint)top_blob->c;
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 < (int)uVar35);
            }
            iVar27 = 0;
          }
        }
      }
      else {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,_outd,
                   (void *)(ulong)uVar33);
        if ((Mat *)&bottom_blob_shapes != top_blob) {
          if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(bottom_blob_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish)->data + 1;
            UNLOCK();
          }
          piVar34 = top_blob->refcount;
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          top_blob->refcount =
               (int *)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          top_blob->elemsize =
               (size_t)bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          top_blob->elempack = iStack_d0;
          top_blob->allocator = local_c8;
          top_blob->dims = iStack_c0;
          top_blob->w = iStack_bc;
          top_blob->h = iStack_b8;
          top_blob->d = iStack_b4;
          top_blob->c = iStack_b0;
          top_blob->cstep = local_a8;
        }
        if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_c8 == (Allocator *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*local_c8->_vptr_Allocator[3])();
            }
          }
        }
        iVar27 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar27 = _outc + 7;
          if (-1 < _outc) {
            iVar27 = _outc;
          }
          uVar33 = iVar27 >> 3;
          goto LAB_00282254;
        }
      }
      piVar34 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar34 == (int *)0x0) {
        return iVar27;
      }
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 != 0) {
        return iVar27;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar27;
      }
      goto joined_r0x00281e47;
    }
  }
switchD_00280a19_default:
  piVar34 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar20 = bottom_blob->dims;
  uVar21 = bottom_blob->w;
  uVar22 = bottom_blob->h;
  uVar23 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + 1;
    UNLOCK();
  }
  m.dims = uVar20;
  m.w = uVar21;
  m.h = uVar22;
  m.d = uVar23;
  if (local_ec == 1) {
LAB_002816bf:
    iVar27 = Crop::forward(&this->super_Crop,&m,top_blob,opt);
  }
  else {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)opt->workspace_allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) goto LAB_002816bf;
    iVar27 = -100;
  }
  piVar34 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_00281716:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}